

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::HorzSuperresQThreshEndToEndTest::PreEncodeFrameHook
          (HorzSuperresQThreshEndToEndTest *this)

{
  Encoder *in_RDX;
  VideoSource *in_RSI;
  
  anon_unknown.dwarf_18a4c97::HorzSuperresQThreshEndToEndTest::PreEncodeFrameHook
            ((HorzSuperresQThreshEndToEndTest *)(this + -0x18),in_RSI,in_RDX);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 0);

      // Set cpu-used = 8 for speed
      encoder->Control(AOME_SET_CPUUSED, 8);

      // Test screen coding tools
      if (test_video_param_.screen_content)
        encoder->Control(AV1E_SET_TUNE_CONTENT, AOM_CONTENT_SCREEN);
      else
        encoder->Control(AV1E_SET_TUNE_CONTENT, AOM_CONTENT_DEFAULT);

      encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
      encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
      encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
    }
  }